

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermAggregate * __thiscall
glslang::HlslParseContext::assignClipCullDistance
          (HlslParseContext *this,TSourceLoc *loc,TOperator op,int semanticId,TIntermTyped *left,
          TIntermTyped *right)

{
  int iVar1;
  EShLanguage EVar2;
  TVector<glslang::TArraySize> *pTVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  undefined4 extraout_var;
  TIntermTyped *node;
  undefined4 extraout_var_00;
  ulong uVar12;
  undefined4 extraout_var_01;
  TSmallArrayVector *pTVar13;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined8 *s;
  TArraySizes *this_00;
  long *plVar14;
  TVariable *pTVar15;
  TIntermSymbol *node_00;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  TIntermAggregate *pTVar16;
  TIntermSymbol *pTVar17;
  TIntermTyped *node_01;
  undefined4 extraout_var_14;
  TIntermTyped *pTVar18;
  TIntermAggregate *left_00;
  _func_int **pp_Var19;
  uint uVar20;
  TIntermTyped *right_00;
  int pos;
  long lVar21;
  undefined8 *puVar22;
  uint uVar23;
  int internalComponent;
  uint uVar24;
  bool bVar25;
  byte bVar26;
  uint local_12c;
  ulong local_128;
  uint local_11c;
  array<int,_2UL> semanticOffset;
  anon_class_16_2_633b926d addIndex;
  undefined8 local_b8 [3];
  ushort local_9c;
  TArraySizes *local_68;
  undefined4 extraout_var_06;
  
  bVar26 = 0;
  EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
  if ((EVar2 < EShLangCompute) && ((0x19U >> (EVar2 & 0x1f) & 1) != 0)) {
    iVar8 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
    bVar5 = isClipOrCullDistance((TType *)CONCAT44(extraout_var,iVar8));
    node = left;
    pTVar18 = right;
    if (bVar5) {
      node = right;
      pTVar18 = left;
    }
    iVar8 = (*(pTVar18->super_TIntermNode)._vptr_TIntermNode[0x21])(pTVar18);
    uVar20 = *(uint *)(CONCAT44(extraout_var_00,iVar8) + 8) >> 7 & 0x1ff;
    if (uVar20 == 0x22) {
      local_128 = (ulong)!bVar5 << 4 | 0x908;
      uVar12 = (ulong)bVar5 << 4 | 0x928;
    }
    else {
      if (uVar20 != 0x21) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                      ,0xa53,
                      "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                     );
      }
      local_128 = (ulong)!bVar5 << 4 | 0x900;
      uVar12 = (ulong)bVar5 << 4 | 0x920;
    }
    iVar8 = 0;
    uVar20 = 0;
    for (lVar21 = 0; lVar21 != 2; lVar21 = lVar21 + 1) {
      iVar9 = *(int *)((long)&(this->super_TParseContextBase).super_TParseVersions.
                              _vptr_TParseVersions + lVar21 * 4 + uVar12);
      uVar23 = uVar20 + 3 & 0xfffffffc;
      iVar1 = 0;
      if (iVar9 + iVar8 < 5) {
        uVar23 = uVar20;
        iVar1 = iVar8;
      }
      semanticOffset._M_elems[lVar21] = uVar23;
      iVar8 = iVar1 + iVar9;
      uVar20 = uVar23 + iVar9;
    }
    iVar8 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    pTVar13 = (TSmallArrayVector *)
              (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar8) + 0x98))
                        ((long *)CONCAT44(extraout_var_01,iVar8));
    iVar8 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    cVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar8) + 0xe8))
                      ((long *)CONCAT44(extraout_var_02,iVar8));
    iVar8 = 0;
    if ((cVar6 != '\0') && (pTVar3 = pTVar13->sizes, pTVar3 != (TVector<glslang::TArraySize> *)0x0))
    {
      iVar8 = (int)((ulong)((long)(pTVar3->
                                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ).
                                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar3->
                                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ).
                                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    iVar9 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    uVar23 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar9) + 0x60))
                       ((long *)CONCAT44(extraout_var_03,iVar9));
    local_11c = 1;
    if (iVar8 < 1) {
      bVar4 = false;
      local_12c = 1;
    }
    else {
      local_12c = TSmallArrayVector::getDimSize(pTVar13,iVar8 + -1);
      if (iVar8 == 1) {
        bVar4 = false;
        local_11c = 1;
      }
      else {
        local_11c = TSmallArrayVector::getDimSize(pTVar13,0);
        bVar4 = true;
      }
    }
    bVar25 = (this->super_TParseContextBase).super_TParseVersions.language != EShLangGeometry;
    pTVar15 = *(TVariable **)
               ((long)&(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions +
               local_128);
    if (pTVar15 == (TVariable *)0x0) {
      uVar10 = 1;
      uVar24 = uVar10;
      if (bVar4 || (bVar25 || bVar5)) {
        uVar24 = local_12c;
      }
      if (0 < iVar8) {
        uVar10 = TSmallArrayVector::getDimSize(pTVar13,0);
      }
      iVar9 = (*(pTVar18->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar18);
      lVar21 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar9) + 0x58))
                         ((long *)CONCAT44(extraout_var_04,iVar9));
      TType::TType((TType *)&addIndex,EbtFloat,*(TStorageQualifier *)(lVar21 + 8) & 0x7f,1,0,0,false
                  );
      iVar9 = (*(pTVar18->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar18);
      s = (undefined8 *)
          (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar9) + 0x58))
                    ((long *)CONCAT44(extraout_var_05,iVar9));
      puVar22 = local_b8;
      for (lVar21 = 10; lVar21 != 0; lVar21 = lVar21 + -1) {
        *puVar22 = *s;
        s = s + (ulong)bVar26 * -2 + 1;
        puVar22 = puVar22 + (ulong)bVar26 * -2 + 1;
      }
      this_00 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)s);
      (this_00->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_00a5b8c8;
      (this_00->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
      this_00->implicitArraySize = 0;
      this_00->implicitlySized = true;
      this_00->variablyIndexed = false;
      if (!bVar25 && !bVar5) {
        TArraySizes::addInnerSize(this_00,uVar10);
      }
      TArraySizes::addInnerSize(this_00,uVar24 * uVar20);
      local_68 = this_00;
      iVar9 = (*(pTVar18->super_TIntermNode)._vptr_TIntermNode[0xc])(pTVar18);
      plVar14 = (long *)CONCAT44(extraout_var_06,iVar9);
      if (plVar14 == (long *)0x0) {
        __assert_fail("sym != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                      ,0xa96,
                      "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                     );
      }
      local_9c = local_9c | 0xfff;
      lVar21 = (**(code **)(*plVar14 + 400))(plVar14);
      pTVar15 = makeInternalVariable(this,*(char **)(lVar21 + 8),(TType *)&addIndex);
      *(TVariable **)
       ((long)&(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions + local_128
       ) = pTVar15;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                (this,pTVar15);
      pTVar15 = *(TVariable **)
                 ((long)&(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions +
                 local_128);
    }
    node_00 = TIntermediate::addSymbol
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,pTVar15);
    iVar9 = (*(node_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node_00);
    uVar20 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar9) + 0x60))
                       ((long *)CONCAT44(extraout_var_07,iVar9));
    iVar9 = (*(node_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node_00);
    pTVar13 = (TSmallArrayVector *)
              (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar9) + 0x98))
                        ((long *)CONCAT44(extraout_var_08,iVar9));
    if (bVar25 || bVar5) {
      uVar24 = 1;
    }
    else {
      uVar24 = TSmallArrayVector::getDimSize(pTVar13,0);
    }
    uVar10 = TSmallArrayVector::getDimSize(pTVar13,(uint)(!bVar25 && !bVar5));
    iVar9 = (*(node_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node_00);
    cVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar9) + 0xe8))
                      ((long *)CONCAT44(extraout_var_09,iVar9));
    if (cVar6 == '\0') {
      __assert_fail("clipCullSym->getType().isArray()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0xaaf,
                    "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                   );
    }
    iVar9 = (*(node_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node_00);
    iVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar9) + 0x60))
                      ((long *)CONCAT44(extraout_var_10,iVar9));
    if (iVar9 != 1) {
      __assert_fail("clipCullSym->getType().getVectorSize() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0xab0,
                    "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                   );
    }
    iVar9 = (*(node_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node_00);
    iVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar9) + 0x38))
                      ((long *)CONCAT44(extraout_var_11,iVar9));
    if (iVar9 != 1) {
      __assert_fail("clipCullSym->getType().getBasicType() == EbtFloat",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0xab1,
                    "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                   );
    }
    iVar9 = (*(node_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node_00);
    cVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar9) + 0xe8))
                      ((long *)CONCAT44(extraout_var_12,iVar9));
    iVar9 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    cVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar9) + 0xe8))
                      ((long *)CONCAT44(extraout_var_13,iVar9));
    if ((((uVar20 == uVar23) && (uVar24 == local_11c)) && (uVar10 == local_12c)) && (cVar6 == cVar7)
       ) {
      pTVar17 = node_00;
      if (bVar5) {
        pTVar17 = (TIntermSymbol *)right;
        left = &node_00->super_TIntermTyped;
      }
      pTVar18 = TIntermediate::addAssign
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,op,left
                           ,&pTVar17->super_TIntermTyped,loc);
      left_00 = TIntermediate::growAggregate
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           (TIntermNode *)0x0,&pTVar18->super_TIntermNode);
      pp_Var19 = (left_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                 _vptr_TIntermNode;
    }
    else {
      iVar9 = semanticOffset._M_elems[semanticId];
      left_00 = (TIntermAggregate *)0x0;
      if ((int)uVar23 < 1) {
        uVar23 = 0;
      }
      if ((int)local_12c < 1) {
        local_12c = 0;
      }
      pTVar16 = (TIntermAggregate *)(ulong)local_11c;
      if ((int)local_11c < 1) {
        pTVar16 = left_00;
      }
      iVar1 = 0;
      addIndex.this = this;
      addIndex.loc = loc;
      for (pos = 0; pos != (int)pTVar16; pos = pos + 1) {
        for (uVar20 = 0; uVar20 != local_12c; uVar20 = uVar20 + 1) {
          for (uVar24 = 0; uVar23 != uVar24; uVar24 = uVar24 + 1) {
            pTVar17 = node_00;
            if (!bVar25 && !bVar5) {
              pTVar17 = (TIntermSymbol *)
                        assignClipCullDistance::anon_class_16_2_633b926d::operator()
                                  (&addIndex,&node_00->super_TIntermTyped,iVar1);
            }
            iVar11 = iVar9 + 1;
            pTVar18 = assignClipCullDistance::anon_class_16_2_633b926d::operator()
                                (&addIndex,&pTVar17->super_TIntermTyped,iVar9);
            iVar9 = iVar11;
            if ((int)uVar10 <= iVar11 && (!bVar25 && !bVar5)) {
              iVar1 = iVar1 + 1;
              iVar9 = semanticOffset._M_elems[semanticId];
            }
            node_01 = node;
            if (bVar4) {
              node_01 = assignClipCullDistance::anon_class_16_2_633b926d::operator()
                                  (&addIndex,node,pos);
            }
            if (0 < iVar8) {
              node_01 = assignClipCullDistance::anon_class_16_2_633b926d::operator()
                                  (&addIndex,node_01,uVar20);
            }
            iVar11 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
            cVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar11) + 0xd8))
                              ((long *)CONCAT44(extraout_var_14,iVar11));
            if (cVar6 != '\0') {
              node_01 = assignClipCullDistance::anon_class_16_2_633b926d::operator()
                                  (&addIndex,node_01,uVar24);
            }
            right_00 = pTVar18;
            if (bVar5) {
              right_00 = node_01;
              node_01 = pTVar18;
            }
            pTVar18 = TIntermediate::addAssign
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                 op,node_01,right_00,loc);
            left_00 = TIntermediate::growAggregate
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                 (TIntermNode *)left_00,&pTVar18->super_TIntermNode);
          }
        }
      }
      if (left_00 == (TIntermAggregate *)0x0) {
        __assert_fail("assignList != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                      ,0xb09,
                      "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                     );
      }
      pp_Var19 = (left_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                 _vptr_TIntermNode;
    }
    (*pp_Var19[0x31])(left_00,1);
  }
  else {
    left_00 = (TIntermAggregate *)0x0;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"unimplemented: clip/cull not currently implemented for this stage","","");
  }
  return left_00;
}

Assistant:

TIntermAggregate* HlslParseContext::assignClipCullDistance(const TSourceLoc& loc, TOperator op, int semanticId,
                                                           TIntermTyped* left, TIntermTyped* right)
{
    switch (language) {
    case EShLangFragment:
    case EShLangVertex:
    case EShLangGeometry:
        break;
    default:
        error(loc, "unimplemented: clip/cull not currently implemented for this stage", "", "");
        return nullptr;
    }

    TVariable** clipCullVar = nullptr;

    // Figure out if we are assigning to, or from, clip or cull distance.
    const bool isOutput = isClipOrCullDistance(left->getType());

    // This is the rvalue or lvalue holding the clip or cull distance.
    TIntermTyped* clipCullNode = isOutput ? left : right;
    // This is the value going into or out of the clip or cull distance.
    TIntermTyped* internalNode = isOutput ? right : left;

    const TBuiltInVariable builtInType = clipCullNode->getQualifier().builtIn;

    decltype(clipSemanticNSizeIn)* semanticNSize = nullptr;

    // Refer to either the clip or the cull distance, depending on semantic.
    switch (builtInType) {
    case EbvClipDistance:
        clipCullVar = isOutput ? &clipDistanceOutput : &clipDistanceInput;
        semanticNSize = isOutput ? &clipSemanticNSizeOut : &clipSemanticNSizeIn;
        break;
    case EbvCullDistance:
        clipCullVar = isOutput ? &cullDistanceOutput : &cullDistanceInput;
        semanticNSize = isOutput ? &cullSemanticNSizeOut : &cullSemanticNSizeIn;
        break;

    // called invalidly: we expected a clip or a cull distance.
    // static compile time problem: should not happen.
    default: assert(0); return nullptr;
    }

    // This is the offset in the destination array of a given semantic's data
    std::array<int, maxClipCullRegs> semanticOffset;

    // Calculate offset of variable of semantic N in destination array
    int arrayLoc = 0;
    int vecItems = 0;

    for (int x = 0; x < maxClipCullRegs; ++x) {
        // See if we overflowed the vec4 packing
        if ((vecItems + (*semanticNSize)[x]) > 4) {
            arrayLoc = (arrayLoc + 3) & (~0x3); // round up to next multiple of 4
            vecItems = 0;
        }

        semanticOffset[x] = arrayLoc;
        vecItems += (*semanticNSize)[x];
        arrayLoc += (*semanticNSize)[x];
    }


    // It can have up to 2 array dimensions (in the case of geometry shader inputs)
    const TArraySizes* const internalArraySizes = internalNode->getType().getArraySizes();
    const int internalArrayDims = internalNode->getType().isArray() ? internalArraySizes->getNumDims() : 0;
    // vector sizes:
    const int internalVectorSize = internalNode->getType().getVectorSize();
    // array sizes, or 1 if it's not an array:
    const int internalInnerArraySize = (internalArrayDims > 0 ? internalArraySizes->getDimSize(internalArrayDims-1) : 1);
    const int internalOuterArraySize = (internalArrayDims > 1 ? internalArraySizes->getDimSize(0) : 1);

    // The created type may be an array of arrays, e.g, for geometry shader inputs.
    const bool isImplicitlyArrayed = (language == EShLangGeometry && !isOutput);

    // If we haven't created the output already, create it now.
    if (*clipCullVar == nullptr) {
        // ClipDistance and CullDistance are handled specially in the entry point input/output copy
        // algorithm, because they may need to be unpacked from components of vectors (or a scalar)
        // into a float array, or vice versa.  Here, we make the array the right size and type,
        // which depends on the incoming data, which has several potential dimensions:
        //    * Semantic ID
        //    * vector size
        //    * array size
        // Of those, semantic ID and array size cannot appear simultaneously.
        //
        // Also to note: for implicitly arrayed forms (e.g, geometry shader inputs), we need to create two
        // array dimensions.  The shader's declaration may have one or two array dimensions.  One is always
        // the geometry's dimension.

        const bool useInnerSize = internalArrayDims > 1 || !isImplicitlyArrayed;

        const int requiredInnerArraySize = arrayLoc * (useInnerSize ? internalInnerArraySize : 1);
        const int requiredOuterArraySize = (internalArrayDims > 0) ? internalArraySizes->getDimSize(0) : 1;

        TType clipCullType(EbtFloat, clipCullNode->getType().getQualifier().storage, 1);
        clipCullType.getQualifier() = clipCullNode->getType().getQualifier();

        // Create required array dimension
        TArraySizes* arraySizes = new TArraySizes;
        if (isImplicitlyArrayed)
            arraySizes->addInnerSize(requiredOuterArraySize);
        arraySizes->addInnerSize(requiredInnerArraySize);
        clipCullType.transferArraySizes(arraySizes);

        // Obtain symbol name: we'll use that for the symbol we introduce.
        TIntermSymbol* sym = clipCullNode->getAsSymbolNode();
        assert(sym != nullptr);

        // We are moving the semantic ID from the layout location, so it is no longer needed or
        // desired there.
        clipCullType.getQualifier().layoutLocation = TQualifier::layoutLocationEnd;

        // Create variable and track its linkage
        *clipCullVar = makeInternalVariable(sym->getName().c_str(), clipCullType);

        trackLinkage(**clipCullVar);
    }

    // Create symbol for the clip or cull variable.
    TIntermSymbol* clipCullSym = intermediate.addSymbol(**clipCullVar);

    // vector sizes:
    const int clipCullVectorSize = clipCullSym->getType().getVectorSize();

    // array sizes, or 1 if it's not an array:
    const TArraySizes* const clipCullArraySizes = clipCullSym->getType().getArraySizes();
    const int clipCullOuterArraySize = isImplicitlyArrayed ? clipCullArraySizes->getDimSize(0) : 1;
    const int clipCullInnerArraySize = clipCullArraySizes->getDimSize(isImplicitlyArrayed ? 1 : 0);

    // clipCullSym has got to be an array of scalar floats, per SPIR-V semantics.
    // fixBuiltInIoType() should have handled that upstream.
    assert(clipCullSym->getType().isArray());
    assert(clipCullSym->getType().getVectorSize() == 1);
    assert(clipCullSym->getType().getBasicType() == EbtFloat);

    // We may be creating multiple sub-assignments.  This is an aggregate to hold them.
    // TODO: it would be possible to be clever sometimes and avoid the sequence node if not needed.
    TIntermAggregate* assignList = nullptr;

    // Holds individual component assignments as we make them.
    TIntermTyped* clipCullAssign = nullptr;

    // If the types are homomorphic, use a simple assign.  No need to mess about with
    // individual components.
    if (clipCullSym->getType().isArray() == internalNode->getType().isArray() &&
        clipCullInnerArraySize == internalInnerArraySize &&
        clipCullOuterArraySize == internalOuterArraySize &&
        clipCullVectorSize == internalVectorSize) {

        if (isOutput)
            clipCullAssign = intermediate.addAssign(op, clipCullSym, internalNode, loc);
        else
            clipCullAssign = intermediate.addAssign(op, internalNode, clipCullSym, loc);

        assignList = intermediate.growAggregate(assignList, clipCullAssign);
        assignList->setOperator(EOpSequence);

        return assignList;
    }

    // We are going to copy each component of the internal (per array element if indicated) to sequential
    // array elements of the clipCullSym.  This tracks the lhs element we're writing to as we go along.
    // We may be starting in the middle - e.g, for a non-zero semantic ID calculated above.
    int clipCullInnerArrayPos = semanticOffset[semanticId];
    int clipCullOuterArrayPos = 0;

    // Lambda to add an index to a node, set the type of the result, and return the new node.
    const auto addIndex = [this, &loc](TIntermTyped* node, int pos) -> TIntermTyped* {
        const TType derefType(node->getType(), 0);
        node = intermediate.addIndex(EOpIndexDirect, node, intermediate.addConstantUnion(pos, loc), loc);
        node->setType(derefType);
        return node;
    };

    // Loop through every component of every element of the internal, and copy to or from the matching external.
    for (int internalOuterArrayPos = 0; internalOuterArrayPos < internalOuterArraySize; ++internalOuterArrayPos) {
        for (int internalInnerArrayPos = 0; internalInnerArrayPos < internalInnerArraySize; ++internalInnerArrayPos) {
            for (int internalComponent = 0; internalComponent < internalVectorSize; ++internalComponent) {
                // clip/cull array member to read from / write to:
                TIntermTyped* clipCullMember = clipCullSym;

                // If implicitly arrayed, there is an outer array dimension involved
                if (isImplicitlyArrayed)
                    clipCullMember = addIndex(clipCullMember, clipCullOuterArrayPos);

                // Index into proper array position for clip cull member
                clipCullMember = addIndex(clipCullMember, clipCullInnerArrayPos++);

                // if needed, start over with next outer array slice.
                if (isImplicitlyArrayed && clipCullInnerArrayPos >= clipCullInnerArraySize) {
                    clipCullInnerArrayPos = semanticOffset[semanticId];
                    ++clipCullOuterArrayPos;
                }

                // internal member to read from / write to:
                TIntermTyped* internalMember = internalNode;

                // If internal node has outer array dimension, index appropriately.
                if (internalArrayDims > 1)
                    internalMember = addIndex(internalMember, internalOuterArrayPos);

                // If internal node has inner array dimension, index appropriately.
                if (internalArrayDims > 0)
                    internalMember = addIndex(internalMember, internalInnerArrayPos);

                // If internal node is a vector, extract the component of interest.
                if (internalNode->getType().isVector())
                    internalMember = addIndex(internalMember, internalComponent);

                // Create an assignment: output from internal to clip cull, or input from clip cull to internal.
                if (isOutput)
                    clipCullAssign = intermediate.addAssign(op, clipCullMember, internalMember, loc);
                else
                    clipCullAssign = intermediate.addAssign(op, internalMember, clipCullMember, loc);

                // Track assignment in the sequence.
                assignList = intermediate.growAggregate(assignList, clipCullAssign);
            }
        }
    }

    assert(assignList != nullptr);
    assignList->setOperator(EOpSequence);

    return assignList;
}